

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::log_internal::EncodeMessageLength
          (log_internal *this,Span<char> msg,Span<char> *buf)

{
  Span<char> local_10;
  
  local_10.len_ = (size_type)msg.ptr_;
  if (this != (log_internal *)0x0) {
    local_10.ptr_ = (pointer)this;
    if (*(log_internal **)msg.len_ < this) {
      __assert_fail("buf->data() >= msg.data()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/log/internal/proto.cc"
                    ,0x93,
                    "void absl::log_internal::EncodeMessageLength(absl::Span<char>, const absl::Span<char> *)"
                   );
    }
    anon_unknown_1::EncodeRawVarint
              ((long)*(log_internal **)msg.len_ - (long)(this + local_10.len_),local_10.len_,
               &local_10);
  }
  return;
}

Assistant:

void EncodeMessageLength(absl::Span<char> msg, const absl::Span<char> *buf) {
  if (!msg.data()) return;
  assert(buf->data() >= msg.data());
  if (buf->data() < msg.data()) return;
  EncodeRawVarint(
      static_cast<uint64_t>(buf->data() - (msg.data() + msg.size())),
      msg.size(), &msg);
}